

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

SQInteger __thiscall SQBlob::Read(SQBlob *this,void *buffer,SQInteger size)

{
  bool bVar1;
  size_t in_RDX;
  void *in_RSI;
  SQBlob *in_RDI;
  SQInteger n;
  size_t local_28;
  
  bVar1 = CanAdvance(in_RDI,in_RDX);
  local_28 = in_RDX;
  if (!bVar1) {
    if (in_RDI->_size - in_RDI->_ptr < 1) {
      return 0;
    }
    local_28 = in_RDI->_size - in_RDI->_ptr;
  }
  memcpy(in_RSI,in_RDI->_buf + in_RDI->_ptr,local_28);
  in_RDI->_ptr = local_28 + in_RDI->_ptr;
  return local_28;
}

Assistant:

SQInteger Read(void *buffer,SQInteger size) override {
        SQInteger n = size;
        if(!CanAdvance(size)) {
            if((_size - _ptr) > 0)
                n = _size - _ptr;
            else return 0;
        }
        memcpy(buffer, &_buf[_ptr], n);
        _ptr += n;
        return n;
    }